

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

void __thiscall XPMP2::Aircraft::SoundStop(Aircraft *this,uint64_t sndId)

{
  uint uVar1;
  uint64_t sndId_local;
  long *local_38 [2];
  long local_28 [2];
  
  if (gpSndSys != (long *)0x0) {
    sndId_local = sndId;
    (**(code **)(*gpSndSys + 0x28))();
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::remove
              (&this->chnList,(char *)&sndId_local);
    if ((DAT_002ec424 == '\x01') && (glob < 1)) {
      uVar1 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_38,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x2e7,"SoundStop",logDEBUG,"Aircraft %08X (%s): Sound id %lu stopped",(ulong)uVar1,
             local_38[0],sndId_local);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void Aircraft::SoundStop (uint64_t sndId)
{
    if (!gpSndSys) return;
    gpSndSys->Stop(sndId);
    chnList.remove(sndId);
    LOG_MATCHING(logDEBUG, "Aircraft %08X (%s): Sound id %lu stopped",
                 modeS_id, GetFlightId().c_str(), (unsigned long)sndId);
}